

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

ssize_t __thiscall
phosg::StringReader::pread_abi_cxx11_
          (StringReader *this,int __fd,void *__buf,size_t __nbytes,__off_t __offset)

{
  long lVar1;
  long lVar2;
  undefined4 in_register_00000034;
  allocator<char> local_3d [20];
  allocator<char> local_29;
  size_t local_28;
  size_t size_local;
  size_t offset_local;
  StringReader *this_local;
  
  offset_local = CONCAT44(in_register_00000034,__fd);
  local_28 = __nbytes;
  size_local = (size_t)__buf;
  this_local = this;
  if (__buf < *(void **)(offset_local + 0x20)) {
    if (*(ulong *)(offset_local + 0x20) < (long)__buf + __nbytes) {
      lVar1 = *(long *)(offset_local + 0x18);
      lVar2 = *(long *)(offset_local + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)this,(char *)(lVar1 + (long)__buf),lVar2 - (long)__buf,&local_29);
      ::std::allocator<char>::~allocator(&local_29);
    }
    else {
      lVar1 = *(long *)(offset_local + 0x18);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,(char *)(lVar1 + (long)__buf),__nbytes,local_3d)
      ;
      ::std::allocator<char>::~allocator(local_3d);
    }
  }
  else {
    ::std::__cxx11::string::string((string *)this);
  }
  return (ssize_t)this;
}

Assistant:

string StringReader::pread(size_t offset, size_t size) const {
  if (offset >= this->length) {
    return string();
  }
  if (offset + size > this->length) {
    return string(reinterpret_cast<const char*>(this->data + offset), this->length - offset);
  }
  return string(reinterpret_cast<const char*>(this->data + offset), size);
}